

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nucleon.h
# Opt level: O3

bool __thiscall
trento::NucleonCommon::participate(NucleonCommon *this,NucleonData *A,NucleonData *B)

{
  normal_distribution<double> *pnVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  pointer pCVar4;
  pointer pCVar5;
  undefined1 auVar6 [16];
  ulong uVar7;
  undefined1 auVar8 [16];
  long lVar9;
  bool bVar10;
  pointer pCVar11;
  ulong uVar12;
  pointer pCVar13;
  Constituent *qA;
  undefined1 auVar14 [16];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  result_type_conflict rVar24;
  result_type_conflict rVar25;
  result_type_conflict rVar26;
  double dVar27;
  double dVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 in_ZMM3 [64];
  undefined1 in_XMM7 [16];
  
  if (((A->is_participant_ != true) || (B->is_participant_ != true)) ||
     (bVar10 = true, this->calc_ncoll_ == true)) {
    auVar6._0_8_ = A->x_;
    auVar6._8_8_ = A->y_;
    auVar14._0_8_ = B->x_;
    auVar14._8_8_ = B->y_;
    auVar6 = vsubpd_avx(auVar6,auVar14);
    if (auVar6._0_8_ * auVar6._0_8_ + auVar6._8_8_ * auVar6._8_8_ <= this->max_impact_sq_) {
      if (A->constituents_exist_ == false) {
        std::
        vector<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
        ::resize(&A->constituents_,this->constituent_number_);
        pCVar11 = (A->constituents_).
                  super__Vector_base<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pCVar4 = (A->constituents_).
                 super__Vector_base<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pCVar11 != pCVar4) {
          pnVar1 = &this->constituent_position_dist_;
          dVar28 = 0.0;
          dVar27 = 0.0;
          do {
            rVar24 = std::normal_distribution<double>::operator()
                               (pnVar1,(mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                                        *)&random::engine,&pnVar1->_M_param);
            rVar25 = std::normal_distribution<double>::operator()
                               (pnVar1,(mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                                        *)&random::engine,&pnVar1->_M_param);
            pCVar11->x = rVar24;
            pCVar11->y = rVar25;
            rVar26 = std::gamma_distribution<double>::operator()
                               (&this->participant_fluctuation_dist_,
                                (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                                 *)&random::engine,&(this->participant_fluctuation_dist_)._M_param);
            pCVar11->fluctuation = rVar26;
            pCVar11 = pCVar11 + 1;
            dVar28 = dVar28 + rVar24;
            dVar27 = dVar27 + rVar25;
          } while (pCVar11 != pCVar4);
          pCVar11 = (A->constituents_).
                    super__Vector_base<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pCVar4 = (A->constituents_).
                   super__Vector_base<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (pCVar11 != pCVar4) {
            lVar9 = -0x18 - (long)pCVar11;
            uVar12 = 0;
            auVar15 = vpbroadcastq_avx512f();
            auVar6 = vcvtusi2sd_avx512f(in_ZMM3._0_16_,this->constituent_number_);
            auVar15 = vpsrlq_avx512f(auVar15,4);
            auVar16 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
            auVar30._8_8_ = 0;
            auVar30._0_8_ = A->x_ - dVar28 / auVar6._0_8_;
            auVar17 = vbroadcastsd_avx512f(auVar30);
            auVar32._8_8_ = 0;
            auVar32._0_8_ = A->y_ - dVar27 / auVar6._0_8_;
            auVar18 = vbroadcastsd_avx512f(auVar32);
            do {
              auVar19 = vpbroadcastq_avx512f();
              uVar12 = uVar12 + 8;
              auVar19 = vporq_avx512f(auVar19,auVar16);
              uVar7 = vpcmpuq_avx512f(auVar19,auVar15,2);
              auVar19 = vgatherdpd_avx512f(*(undefined4 *)&pCVar11->x);
              auVar20._8_8_ = (ulong)((byte)(uVar7 >> 1) & 1) * auVar19._8_8_;
              auVar20._0_8_ = (ulong)((byte)uVar7 & 1) * auVar19._0_8_;
              auVar20._16_8_ = (ulong)((byte)(uVar7 >> 2) & 1) * auVar19._16_8_;
              auVar20._24_8_ = (ulong)((byte)(uVar7 >> 3) & 1) * auVar19._24_8_;
              auVar20._32_8_ = (ulong)((byte)(uVar7 >> 4) & 1) * auVar19._32_8_;
              auVar20._40_8_ = (ulong)((byte)(uVar7 >> 5) & 1) * auVar19._40_8_;
              auVar20._48_8_ = (ulong)((byte)(uVar7 >> 6) & 1) * auVar19._48_8_;
              auVar20._56_8_ = (uVar7 >> 7) * auVar19._56_8_;
              auVar19 = vaddpd_avx512f(auVar17,auVar20);
              vscatterdpd_avx512f(ZEXT864(pCVar11) + ZEXT3264(_DAT_00125340),uVar7,auVar19);
              auVar19 = vgatherdpd_avx512f(*(undefined4 *)&pCVar11->y);
              auVar21._8_8_ = (ulong)((byte)(uVar7 >> 1) & 1) * auVar19._8_8_;
              auVar21._0_8_ = (ulong)((byte)uVar7 & 1) * auVar19._0_8_;
              auVar21._16_8_ = (ulong)((byte)(uVar7 >> 2) & 1) * auVar19._16_8_;
              auVar21._24_8_ = (ulong)((byte)(uVar7 >> 3) & 1) * auVar19._24_8_;
              auVar21._32_8_ = (ulong)((byte)(uVar7 >> 4) & 1) * auVar19._32_8_;
              auVar21._40_8_ = (ulong)((byte)(uVar7 >> 5) & 1) * auVar19._40_8_;
              auVar21._48_8_ = (ulong)((byte)(uVar7 >> 6) & 1) * auVar19._48_8_;
              auVar21._56_8_ = (uVar7 >> 7) * auVar19._56_8_;
              auVar19 = vaddpd_avx512f(auVar18,auVar21);
              vscatterdpd_avx512f(ZEXT864(pCVar11) + ZEXT3264(_DAT_00125360),uVar7,auVar19);
              pCVar11 = pCVar11 + 8;
            } while (((ulong)((long)pCVar4 + lVar9) / 0x18 + 8 & 0xfffffffffffffff8) != uVar12);
          }
        }
        A->constituents_exist_ = true;
      }
      if (B->constituents_exist_ == false) {
        std::
        vector<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
        ::resize(&B->constituents_,this->constituent_number_);
        pCVar11 = (B->constituents_).
                  super__Vector_base<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pCVar4 = (B->constituents_).
                 super__Vector_base<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pCVar11 != pCVar4) {
          pnVar1 = &this->constituent_position_dist_;
          dVar28 = 0.0;
          dVar27 = 0.0;
          do {
            rVar24 = std::normal_distribution<double>::operator()
                               (pnVar1,(mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                                        *)&random::engine,&pnVar1->_M_param);
            rVar25 = std::normal_distribution<double>::operator()
                               (pnVar1,(mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                                        *)&random::engine,&pnVar1->_M_param);
            pCVar11->x = rVar24;
            pCVar11->y = rVar25;
            rVar26 = std::gamma_distribution<double>::operator()
                               (&this->participant_fluctuation_dist_,
                                (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                                 *)&random::engine,&(this->participant_fluctuation_dist_)._M_param);
            pCVar11->fluctuation = rVar26;
            pCVar11 = pCVar11 + 1;
            dVar28 = dVar28 + rVar24;
            dVar27 = dVar27 + rVar25;
          } while (pCVar11 != pCVar4);
          pCVar11 = (B->constituents_).
                    super__Vector_base<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pCVar4 = (B->constituents_).
                   super__Vector_base<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (pCVar11 != pCVar4) {
            lVar9 = -0x18 - (long)pCVar11;
            uVar12 = 0;
            auVar15 = vpbroadcastq_avx512f();
            auVar6 = vcvtusi2sd_avx512f(in_XMM7,this->constituent_number_);
            auVar15 = vpsrlq_avx512f(auVar15,4);
            auVar16 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
            auVar31._8_8_ = 0;
            auVar31._0_8_ = B->x_ - dVar28 / auVar6._0_8_;
            auVar17 = vbroadcastsd_avx512f(auVar31);
            auVar33._8_8_ = 0;
            auVar33._0_8_ = B->y_ - dVar27 / auVar6._0_8_;
            auVar18 = vbroadcastsd_avx512f(auVar33);
            do {
              auVar19 = vpbroadcastq_avx512f();
              uVar12 = uVar12 + 8;
              auVar19 = vporq_avx512f(auVar19,auVar16);
              uVar7 = vpcmpuq_avx512f(auVar19,auVar15,2);
              auVar19 = vgatherdpd_avx512f(*(undefined4 *)&pCVar11->x);
              auVar22._8_8_ = (ulong)((byte)(uVar7 >> 1) & 1) * auVar19._8_8_;
              auVar22._0_8_ = (ulong)((byte)uVar7 & 1) * auVar19._0_8_;
              auVar22._16_8_ = (ulong)((byte)(uVar7 >> 2) & 1) * auVar19._16_8_;
              auVar22._24_8_ = (ulong)((byte)(uVar7 >> 3) & 1) * auVar19._24_8_;
              auVar22._32_8_ = (ulong)((byte)(uVar7 >> 4) & 1) * auVar19._32_8_;
              auVar22._40_8_ = (ulong)((byte)(uVar7 >> 5) & 1) * auVar19._40_8_;
              auVar22._48_8_ = (ulong)((byte)(uVar7 >> 6) & 1) * auVar19._48_8_;
              auVar22._56_8_ = (uVar7 >> 7) * auVar19._56_8_;
              auVar19 = vaddpd_avx512f(auVar17,auVar22);
              vscatterdpd_avx512f(ZEXT864(pCVar11) + ZEXT3264(_DAT_00125340),uVar7,auVar19);
              auVar19 = vgatherdpd_avx512f(*(undefined4 *)&pCVar11->y);
              auVar23._8_8_ = (ulong)((byte)(uVar7 >> 1) & 1) * auVar19._8_8_;
              auVar23._0_8_ = (ulong)((byte)uVar7 & 1) * auVar19._0_8_;
              auVar23._16_8_ = (ulong)((byte)(uVar7 >> 2) & 1) * auVar19._16_8_;
              auVar23._24_8_ = (ulong)((byte)(uVar7 >> 3) & 1) * auVar19._24_8_;
              auVar23._32_8_ = (ulong)((byte)(uVar7 >> 4) & 1) * auVar19._32_8_;
              auVar23._40_8_ = (ulong)((byte)(uVar7 >> 5) & 1) * auVar19._40_8_;
              auVar23._48_8_ = (ulong)((byte)(uVar7 >> 6) & 1) * auVar19._48_8_;
              auVar23._56_8_ = (uVar7 >> 7) * auVar19._56_8_;
              auVar19 = vaddpd_avx512f(auVar18,auVar23);
              vscatterdpd_avx512f(ZEXT864(pCVar11) + ZEXT3264(_DAT_00125360),uVar7,auVar19);
              pCVar11 = pCVar11 + 8;
            } while (((ulong)((long)pCVar4 + lVar9) / 0x18 + 8 & 0xfffffffffffffff8) != uVar12);
          }
        }
        B->constituents_exist_ = true;
      }
      pCVar4 = (A->constituents_).
               super__Vector_base<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      dVar28 = 0.0;
      for (pCVar11 = (A->constituents_).
                     super__Vector_base<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
                     ._M_impl.super__Vector_impl_data._M_start; pCVar11 != pCVar4;
          pCVar11 = pCVar11 + 1) {
        pCVar5 = (B->constituents_).
                 super__Vector_base<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pCVar13 = (B->constituents_).
                       super__Vector_base<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
                       ._M_impl.super__Vector_impl_data._M_start; pCVar13 != pCVar5;
            pCVar13 = pCVar13 + 1) {
          auVar2._0_8_ = pCVar11->x;
          auVar2._8_8_ = pCVar11->y;
          auVar3._0_8_ = pCVar13->x;
          auVar3._8_8_ = pCVar13->y;
          auVar6 = vsubpd_avx(auVar2,auVar3);
          dVar27 = exp(((auVar6._0_8_ * auVar6._0_8_ + auVar6._8_8_ * auVar6._8_8_) * -0.25) /
                       this->constituent_width_sq_);
          dVar28 = dVar28 + dVar27;
        }
      }
      auVar29._8_8_ = 0;
      auVar29._0_8_ = this->sigma_partonic_;
      auVar8._8_8_ = 0x8000000000000000;
      auVar8._0_8_ = 0x8000000000000000;
      auVar14 = vxorpd_avx512vl(auVar29,auVar8);
      auVar6 = vcvtusi2sd_avx512f(in_XMM7,this->constituent_number_);
      dVar28 = exp(dVar28 * ((auVar14._0_8_ * this->prefactor_) / (auVar6._0_8_ + auVar6._0_8_)));
      dVar27 = std::
               generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                         ((mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                           *)&random::engine);
      if (dVar28 < dVar27) {
        if (A->is_participant_ == false) {
          A->is_participant_ = true;
        }
        if (B->is_participant_ != false) {
          return true;
        }
        B->is_participant_ = true;
        return true;
      }
    }
    bVar10 = false;
  }
  return bVar10;
}

Assistant:

inline bool NucleonCommon::participate(NucleonData& A, NucleonData& B) const {
  // If both nucleons are already participants, there's nothing to do.
  if (A.is_participant() && B.is_participant() && !calc_ncoll_)
    return true;

  auto distance_sq = sqr(A.x() - B.x()) + sqr(A.y() - B.y());

  // Check if nucleons are out of range.
  if (distance_sq > max_impact_sq_)
    return false;

  sample_constituent_positions(A);
  sample_constituent_positions(B);

  auto overlap = 0.;
  for (const auto& qA : A.constituents_) {
    for (const auto& qB : B.constituents_) {
      auto distance_sq = sqr(qA.x - qB.x) + sqr(qA.y - qB.y);
      overlap += std::exp(-.25*distance_sq/constituent_width_sq_);
    }
  }

  // The probability is
  //   P = 1 - exp(...)
  // which we could sample as
  //   P > U
  // where U is a standard uniform (0, 1) random number.  We can also compute
  //   1 - P = exp(...)
  // and then sample
  //   (1 - P) > (1 - U)
  // or equivalently
  //   (1 - P) < U
  auto one_minus_prob = std::exp(
      -sigma_partonic_ * prefactor_/(2.*constituent_number_) * overlap
      );

  // Sample one random number and decide if this pair participates.
  if (one_minus_prob < random::canonical<double>()) {
    set_participant(A);
    set_participant(B);
    return true;
  }

  return false;
}